

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaCommand.cxx
# Opt level: O3

bool __thiscall MetaCommand::GetValueAsBool(MetaCommand *this,Option *option,string *fieldName)

{
  pointer pcVar1;
  pointer pFVar2;
  undefined1 *__s2;
  int iVar3;
  pointer pFVar4;
  string *psVar5;
  bool bVar6;
  string fieldname;
  undefined1 *local_50;
  size_t local_48;
  undefined1 local_40 [16];
  
  pcVar1 = (fieldName->_M_dataplus)._M_p;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + fieldName->_M_string_length);
  if (fieldName->_M_string_length == 0) {
    std::__cxx11::string::_M_assign((string *)&local_50);
  }
  __s2 = local_50;
  pFVar4 = (option->fields).
           super__Vector_base<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>._M_impl.
           super__Vector_impl_data._M_start;
  pFVar2 = (option->fields).
           super__Vector_base<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>._M_impl.
           super__Vector_impl_data._M_finish;
  do {
    if (pFVar4 == pFVar2) {
      bVar6 = false;
LAB_00118d70:
      if (local_50 != local_40) {
        operator_delete(local_50);
      }
      return bVar6;
    }
    if (((pFVar4->name)._M_string_length == local_48) &&
       ((local_48 == 0 || (iVar3 = bcmp((pFVar4->name)._M_dataplus._M_p,__s2,local_48), iVar3 == 0))
       )) {
      psVar5 = &pFVar4->value;
      iVar3 = std::__cxx11::string::compare((char *)psVar5);
      bVar6 = true;
      if ((iVar3 != 0) &&
         ((iVar3 = std::__cxx11::string::compare((char *)psVar5), iVar3 != 0 &&
          (iVar3 = std::__cxx11::string::compare((char *)psVar5), iVar3 != 0)))) {
        iVar3 = std::__cxx11::string::compare((char *)psVar5);
        bVar6 = iVar3 == 0;
      }
      goto LAB_00118d70;
    }
    pFVar4 = pFVar4 + 1;
  } while( true );
}

Assistant:

bool MetaCommand::GetValueAsBool(Option option,METAIO_STL::string fieldName)
{
  METAIO_STL::string fieldname = fieldName;
  if (fieldName.empty()) {
    fieldname = option.name;
  }

  METAIO_STL::vector<Field>::const_iterator itField = option.fields.begin();
  while(itField != option.fields.end())
    {
    if((*itField).name == fieldname)
      {
      if((*itField).value == "true"
         || (*itField).value == "1"
         || (*itField).value == "True"
         || (*itField).value == "TRUE"
        )
        {
        return true;
        }
      return false;
      }
    ++itField;
    }
  return false;
}